

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O3

void __thiscall QSimplex::clearColumns(QSimplex *this,int first,int last)

{
  int iVar1;
  qreal *pqVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = (long)this->rows;
  if (0 < lVar4) {
    iVar1 = this->columns;
    pqVar2 = this->matrix;
    iVar3 = 0;
    do {
      if (first <= last) {
        memset(pqVar2 + (long)first + (long)iVar3,0,(ulong)(uint)(last - first) * 8 + 8);
      }
      iVar3 = iVar3 + iVar1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void QSimplex::clearColumns(int first, int last)
{
    for (int i = 0; i < rows; ++i) {
        qreal *row = matrix + i * columns;
        for (int j = first; j <= last; ++j)
            row[j] = 0.0;
    }
}